

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O3

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *pvVar4;
  void *ptr;
  void *local_58;
  int *local_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  if (this->c == 0) {
    if (this->h == 0) {
      if (this->w == 0) {
        if (((((this->data).dims != 1) || ((this->data).w != 1)) || ((this->data).elemsize != 4)) ||
           (((this->data).elempack != 1 || ((this->data).allocator != (Allocator *)0x0)))) {
          piVar1 = (this->data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar4 = (this->data).data;
              pAVar2 = (this->data).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          (this->data).data = (void *)0x0;
          (this->data).refcount = (int *)0x0;
          (this->data).elemsize = 4;
          (this->data).elempack = 1;
          (this->data).allocator = (Allocator *)0x0;
          (this->data).dims = 1;
          (this->data).w = 1;
          (this->data).h = 1;
          (this->data).c = 1;
          (this->data).cstep = 1;
          local_58 = (void *)0x0;
          iVar3 = posix_memalign(&local_58,0x10,8);
          pvVar4 = (void *)0x0;
          if (iVar3 == 0) {
            pvVar4 = local_58;
          }
          (this->data).data = pvVar4;
          (this->data).refcount = (int *)((long)pvVar4 + 4);
          *(undefined4 *)((long)pvVar4 + 4) = 1;
        }
        goto LAB_001373e3;
      }
      (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->w,1);
      if (&this->data != (Mat *)&local_58) {
        if (local_50 != (int *)0x0) {
          LOCK();
          *local_50 = *local_50 + 1;
          UNLOCK();
        }
        piVar1 = (this->data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar4 = (this->data).data;
            pAVar2 = (this->data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->data).data = local_58;
        (this->data).refcount = local_50;
        (this->data).elemsize = local_48;
        (this->data).elempack = local_40;
        (this->data).allocator = local_38;
        (this->data).dims = local_30;
        (this->data).w = iStack_2c;
        (this->data).h = iStack_28;
        (this->data).c = iStack_24;
        (this->data).cstep = local_20;
      }
      if (local_50 == (int *)0x0) goto LAB_001373e3;
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 != 0) goto LAB_001373e3;
      if (local_38 != (Allocator *)0x0) {
        (*local_38->_vptr_Allocator[3])();
        goto LAB_001373e3;
      }
    }
    else {
      (*mb->_vptr_ModelBin[3])(&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,1);
      if (&this->data != (Mat *)&local_58) {
        if (local_50 != (int *)0x0) {
          LOCK();
          *local_50 = *local_50 + 1;
          UNLOCK();
        }
        piVar1 = (this->data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar4 = (this->data).data;
            pAVar2 = (this->data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->data).data = local_58;
        (this->data).refcount = local_50;
        (this->data).elemsize = local_48;
        (this->data).elempack = local_40;
        (this->data).allocator = local_38;
        (this->data).dims = local_30;
        (this->data).w = iStack_2c;
        (this->data).h = iStack_28;
        (this->data).c = iStack_24;
        (this->data).cstep = local_20;
      }
      if (local_50 == (int *)0x0) goto LAB_001373e3;
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 != 0) goto LAB_001373e3;
      if (local_38 != (Allocator *)0x0) {
        (*local_38->_vptr_Allocator[3])();
        goto LAB_001373e3;
      }
    }
  }
  else {
    (*mb->_vptr_ModelBin[4])
              (&local_58,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,1);
    if (&this->data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar4 = (this->data).data;
          pAVar2 = (this->data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->data).data = local_58;
      (this->data).refcount = local_50;
      (this->data).elemsize = local_48;
      (this->data).elempack = local_40;
      (this->data).allocator = local_38;
      (this->data).dims = local_30;
      (this->data).w = iStack_2c;
      (this->data).h = iStack_28;
      (this->data).c = iStack_24;
      (this->data).cstep = local_20;
    }
    if (local_50 == (int *)0x0) goto LAB_001373e3;
    LOCK();
    *local_50 = *local_50 + -1;
    UNLOCK();
    if (*local_50 != 0) goto LAB_001373e3;
    if (local_38 != (Allocator *)0x0) {
      (*local_38->_vptr_Allocator[3])();
      goto LAB_001373e3;
    }
  }
  if (local_58 != (void *)0x0) {
    free(local_58);
  }
LAB_001373e3:
  if (((this->data).data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->data).c * (this->data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}